

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<1>_>
             *this,back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  size_t sVar1;
  iterator begin;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  unsigned_long *in_RSI;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_RDI;
  char *in_stack_ffffffffffffffb8;
  bin_writer<1> *this_00;
  wchar_t *in_stack_ffffffffffffffd8;
  unsigned_long in_stack_ffffffffffffffe0;
  type in_stack_ffffffffffffffe8;
  
  sVar1 = basic_string_view<char>::size
                    ((basic_string_view<char> *)
                     &((in_RDI.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>).
                      _M_impl.field_0x8);
  if (sVar1 != 0) {
    begin = basic_string_view<char>::begin
                      ((basic_string_view<char> *)
                       &((in_RDI.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>).
                        _M_impl.field_0x8);
    basic_string_view<char>::end
              ((basic_string_view<char> *)
               &((in_RDI.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
                field_0x8);
    in_stack_ffffffffffffffe0 = *in_RSI;
    in_stack_ffffffffffffffe8 =
         internal::
         copy_str<wchar_t,char_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                   (begin,in_stack_ffffffffffffffb8,in_RDI);
    *in_RSI = (unsigned_long)in_stack_ffffffffffffffe8.container;
  }
  this_00 = (bin_writer<1> *)*in_RSI;
  bVar2 = std::
          fill_n<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                    ((back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
                     in_stack_ffffffffffffffe8.container,in_stack_ffffffffffffffe0,
                     in_stack_ffffffffffffffd8);
  *in_RSI = (unsigned_long)bVar2.container;
  int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>::operator()
            (this_00,(back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                     in_RDI.container);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }